

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

bool __thiscall QTextEditMimeData::hasFormat(QTextEditMimeData *this,QString *format)

{
  char *pcVar1;
  char16_t *pcVar2;
  long lVar3;
  char cVar4;
  undefined1 uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  QStringView QVar9;
  QLatin1String QVar10;
  
  cVar4 = QTextDocumentFragment::isEmpty();
  if (cVar4 != '\0') {
    uVar5 = QMimeData::hasFormat((QString *)this);
    return (bool)uVar5;
  }
  pcVar2 = (format->d).ptr;
  lVar3 = (format->d).size;
  uVar7 = 0;
  while( true ) {
    uVar6 = uVar7;
    uVar7 = (ulong)supportedMimeTypes.m_offsets._M_elems[uVar6];
    QVar10.m_data = supportedMimeTypes.m_string._M_elems + uVar7;
    lVar8 = -1;
    do {
      pcVar1 = (char *)(uVar7 + 0x6f1e21 + lVar8);
      lVar8 = lVar8 + 1;
    } while (*pcVar1 != '\0');
    if ((lVar3 == lVar8) &&
       (QVar9.m_data = pcVar2, QVar9.m_size = lVar3, QVar10.m_size = lVar8,
       cVar4 = QtPrivate::equalStrings(QVar9,QVar10), cVar4 != '\0')) break;
    uVar7 = uVar6 + 1;
    if (uVar6 + 1 == 4) {
      return uVar6 < 3;
    }
  }
  return true;
}

Assistant:

bool QTextEditMimeData::hasFormat(const QString &format) const
{
    if (!fragment.isEmpty()) {
        constexpr auto size = supportedMimeTypes.count();
        for (int i = 0; i < size; ++i) {
            if (format == QLatin1StringView(supportedMimeTypes.at(i)))
                return true;
        }
        return false;
    }

    return QMimeData::hasFormat(format);
}